

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  string file;
  int local_f4;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f4 = number;
  if (number == 0) {
    std::operator+(&local_70,&base_name->pathname_,".");
    std::operator+(&local_d0,&local_70,extension);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::operator+(&local_90,&base_name->pathname_,"_");
    StreamableToString<int>(&local_b0,&local_f4);
    std::operator+(&local_50,&local_90,&local_b0);
    std::operator+(&local_70,&local_50,".");
    std::operator+(&local_d0,&local_70,extension);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_d0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  FilePath((FilePath *)&local_d0,&local_f0);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)&local_d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}